

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingGeneric::ComputeForceTorque
          (ChLoadXYZROTnodeXYZROTnodeBushingGeneric *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar8;
  ChVector<double> local_148;
  double angle_rot;
  ChVectorDynamic<> mSdt;
  ChVectorDynamic<> mS;
  ChVectorDynamic<> mF;
  undefined1 local_f0 [56];
  double local_b8;
  double dStack_b0;
  double local_a8;
  ChVector<double> dir_rot;
  ChVector<double> v;
  undefined1 *local_60 [2];
  ChQuaternion<double> rel_rot;
  
  local_f0._0_4_ = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mF,(int *)local_f0);
  local_f0._0_4_ = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mS,(int *)local_f0);
  local_f0._0_4_ = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mSdt,(int *)local_f0);
  v.m_data[0] = (rel_AB->super_ChFrame<double>).coord.pos.m_data[0] +
                (this->neutral_displacement).coord.pos.m_data[0];
  v.m_data[1] = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1] +
                (this->neutral_displacement).coord.pos.m_data[1];
  v.m_data[2] = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2] +
                (this->neutral_displacement).coord.pos.m_data[2];
  ChQuaternion<double>::operator*
            (&rel_rot,&(rel_AB->super_ChFrame<double>).coord.rot,
             &(this->neutral_displacement).coord.rot);
  dir_rot.m_data[2] = 0.0;
  dir_rot.m_data[0] = 0.0;
  dir_rot.m_data[1] = 0.0;
  ChQuaternion<double>::Q_to_AngAxis(&rel_rot,&angle_rot,&dir_rot);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = angle_rot;
  uVar2 = vcmpsd_avx512f(ZEXT816(0x400921fb54442d18),auVar7,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar6._0_8_ = (double)((ulong)bVar3 * (long)(angle_rot + -6.283185307179586) +
                         (ulong)!bVar3 * (long)angle_rot);
  auVar6._8_8_ = 0;
  if ((3.141592653589793 < angle_rot) || (auVar6._0_8_ < -3.141592653589793)) {
    uVar2 = vcmpsd_avx512f(auVar6,ZEXT816(0xc00921fb54442d18),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    angle_rot = (double)((ulong)bVar3 * (long)(auVar6._0_8_ + 6.283185307179586) +
                        (ulong)!bVar3 * (long)auVar6._0_8_);
  }
  local_b8 = angle_rot * dir_rot.m_data[0];
  dStack_b0 = angle_rot * dir_rot.m_data[1];
  local_a8 = angle_rot * dir_rot.m_data[2];
  local_148.m_data[0] = (double)&v;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mS,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_f0,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_148);
  local_148.m_data[0] = (double)&local_b8;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mS,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_f0,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_148);
  local_148.m_data[0] = (double)&rel_AB->coord_dt;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mSdt,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_f0,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_148)
  ;
  ChFrameMoving<double>::GetWvel_par(&local_148,rel_AB);
  local_60[0] = (undefined1 *)&local_148;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mSdt,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_f0,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_60);
  PVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)&this->stiffness,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mS);
  local_f0._16_16_ =
       (undefined1  [16])
       Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)&this->damping,
                  (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&mSdt);
  local_f0._0_16_ = (undefined1  [16])PVar8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (&mF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)local_f0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mF,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
            (&local_148,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             local_f0,(type *)0x0);
  auVar4._8_8_ = local_148.m_data[1];
  auVar4._0_8_ = local_148.m_data[0];
  dVar1 = (this->neutral_force).m_data[2];
  auVar6 = vsubpd_avx(auVar4,*(undefined1 (*) [16])(this->neutral_force).m_data);
  *(undefined1 (*) [16])loc_force->m_data = auVar6;
  loc_force->m_data[2] = local_148.m_data[2] - dVar1;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_f0,&mF,3,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
            (&local_148,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             local_f0,(type *)0x0);
  auVar5._8_8_ = local_148.m_data[1];
  auVar5._0_8_ = local_148.m_data[0];
  dVar1 = (this->neutral_torque).m_data[2];
  auVar6 = vsubpd_avx(auVar5,*(undefined1 (*) [16])(this->neutral_torque).m_data);
  *(undefined1 (*) [16])loc_torque->m_data = auVar6;
  loc_torque->m_data[2] = local_148.m_data[2] - dVar1;
  Eigen::internal::handmade_aligned_free
            (mSdt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (mS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChLoadXYZROTnodeXYZROTnodeBushingGeneric::ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                                                  ChVector<>& loc_force,
                                                                  ChVector<>& loc_torque) {
    // compute local force & torque (assuming small rotations):
    ChVectorDynamic<> mF(6);
    ChVectorDynamic<> mS(6);
    ChVectorDynamic<> mSdt(6);
    ChVector<> rel_pos = rel_AB.GetPos() + neutral_displacement.GetPos();
    ChQuaternion<> rel_rot = rel_AB.GetRot() * neutral_displacement.GetRot();
    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    mS.segment(0, 3) = rel_pos.eigen();
    mS.segment(3, 3) = vect_rot.eigen();
    mSdt.segment(0, 3) = rel_AB.GetPos_dt().eigen();
    mSdt.segment(3, 3) = rel_AB.GetWvel_par().eigen();

    mF = stiffness * mS + damping * mSdt;

    loc_force = ChVector<>(mF.segment(0, 3)) - neutral_force;
    loc_torque = ChVector<>(mF.segment(3, 3)) - neutral_torque;
}